

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_add_int(secp256k1_fe *r,int a)

{
  int in_ESI;
  secp256k1_fe *in_RDI;
  uint3 in_stack_fffffffffffffff0;
  uint uVar1;
  
  uVar1 = (uint)in_stack_fffffffffffffff0;
  if (-1 < in_ESI) {
    uVar1 = CONCAT13(in_ESI < 0x8000,in_stack_fffffffffffffff0);
  }
  if ((((byte)(uVar1 >> 0x18) ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0xe5,"test condition failed: 0 <= a && a <= 0x7FFF");
    abort();
  }
  secp256k1_fe_verify((secp256k1_fe *)CONCAT44(in_ESI,uVar1));
  secp256k1_fe_impl_add_int(in_RDI,in_ESI);
  in_RDI->magnitude = in_RDI->magnitude + 1;
  in_RDI->normalized = 0;
  secp256k1_fe_verify((secp256k1_fe *)CONCAT44(in_ESI,uVar1));
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add_int(secp256k1_fe *r, int a) {
    VERIFY_CHECK(0 <= a && a <= 0x7FFF);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_add_int(r, a);
    r->magnitude += 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}